

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

uint * fetchRGBA16FToARGB32PM_avx2
                 (uint *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                 QDitherInfo *param_6)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  __m128i vsi_1;
  __m128 vsa_1;
  __m128 vsf_1;
  __m128i vsi128;
  __m256i vsi;
  __m256 vsa;
  __m256 vsf;
  int i;
  __m256 vh;
  __m256 vf;
  quint64 *s;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4a0 [16];
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined4 uStack_444;
  int local_424;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_270;
  float fStack_26c;
  float fStack_268;
  uint local_220;
  undefined8 local_1a0;
  
  lVar1 = in_RSI + (long)in_EDX * 8;
  vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar2 = vinsertps_avx(ZEXT416(0x437f0000),ZEXT416(0x437f0000),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x437f0000),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(0x437f0000),0x30);
  auVar3 = vinsertps_avx(ZEXT416(0x437f0000),ZEXT416(0x437f0000),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0x437f0000),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(0x437f0000),0x30);
  auVar9 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f000000),0x20);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f000000),0x30);
  auVar4 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f000000),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f000000),0x30);
  auVar8 = ZEXT3264(CONCAT1616(auVar9,auVar4));
  for (local_424 = 0; local_424 + 1 < in_ECX; local_424 = local_424 + 2) {
    vpcmpeqd_avx2(auVar8._0_32_,auVar8._0_32_);
    auVar7 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar1 + (long)local_424 * 8));
    auVar6 = vpermilps_avx(auVar7,0xff);
    local_300 = auVar7._0_4_;
    fStack_2fc = auVar7._4_4_;
    fStack_2f8 = auVar7._8_4_;
    fStack_2f4 = auVar7._12_4_;
    fStack_2f0 = auVar7._16_4_;
    fStack_2ec = auVar7._20_4_;
    fStack_2e8 = auVar7._24_4_;
    uStack_2e4 = auVar7._28_4_;
    local_320 = auVar6._0_4_;
    fStack_31c = auVar6._4_4_;
    fStack_318 = auVar6._8_4_;
    fStack_314 = auVar6._12_4_;
    fStack_310 = auVar6._16_4_;
    fStack_30c = auVar6._20_4_;
    fStack_308 = auVar6._24_4_;
    local_460._4_4_ = fStack_2fc * fStack_31c;
    local_460._0_4_ = local_300 * local_320;
    fStack_458 = fStack_2f8 * fStack_318;
    fStack_454 = fStack_2f4 * fStack_314;
    fStack_450 = fStack_2f0 * fStack_310;
    fStack_44c = fStack_2ec * fStack_30c;
    fStack_448 = fStack_2e8 * fStack_308;
    uStack_444 = uStack_2e4;
    auVar6 = vblendps_avx(_local_460,auVar6,0x88);
    local_340 = auVar6._0_4_;
    fStack_33c = auVar6._4_4_;
    fStack_338 = auVar6._8_4_;
    fStack_334 = auVar6._12_4_;
    fStack_330 = auVar6._16_4_;
    fStack_32c = auVar6._20_4_;
    fStack_328 = auVar6._24_4_;
    fStack_324 = auVar6._28_4_;
    local_360 = auVar2._0_4_;
    fStack_35c = auVar2._4_4_;
    fStack_358 = auVar2._8_4_;
    fStack_354 = auVar2._12_4_;
    fStack_350 = auVar3._0_4_;
    fStack_34c = auVar3._4_4_;
    fStack_348 = auVar3._8_4_;
    local_2e0 = auVar4._0_4_;
    fStack_2dc = auVar4._4_4_;
    fStack_2d8 = auVar4._8_4_;
    fStack_2d4 = auVar4._12_4_;
    fStack_2d0 = auVar9._0_4_;
    fStack_2cc = auVar9._4_4_;
    fStack_2c8 = auVar9._8_4_;
    fStack_2c4 = auVar9._12_4_;
    local_4a0._4_4_ = (int)(fStack_33c * fStack_35c + fStack_2dc);
    local_4a0._0_4_ = (int)(local_340 * local_360 + local_2e0);
    local_4a0._8_4_ = (int)(fStack_338 * fStack_358 + fStack_2d8);
    local_4a0._12_4_ = (int)(fStack_334 * fStack_354 + fStack_2d4);
    uStack_490._0_4_ = (int)(fStack_330 * fStack_350 + fStack_2d0);
    uStack_490._4_4_ = (int)(fStack_32c * fStack_34c + fStack_2cc);
    uStack_488._0_4_ = (int)(fStack_328 * fStack_348 + fStack_2c8);
    uStack_488._4_4_ = (int)(fStack_324 + fStack_2c4);
    auVar6 = _local_4a0;
    uStack_488 = auVar6._24_8_;
    auVar7._16_8_ = uStack_490;
    auVar7._0_16_ = local_4a0;
    auVar7._24_8_ = uStack_488;
    auVar6._16_8_ = uStack_490;
    auVar6._0_16_ = local_4a0;
    auVar6._24_8_ = uStack_488;
    auVar6 = vpackusdw_avx2(auVar7,auVar6);
    auVar6 = vpshuflw_avx2(auVar6,0xc6);
    auVar6 = vpermq_avx2(auVar6,0xd8);
    auVar5 = vpackuswb_avx(auVar6._0_16_,auVar6._0_16_);
    auVar8 = ZEXT1664(auVar5);
    local_1a0 = auVar5._0_8_;
    *(undefined8 *)(in_RDI + local_424) = local_1a0;
  }
  if (local_424 < in_ECX) {
    vpcmpeqd_avx(auVar8._0_16_,auVar8._0_16_);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(lVar1 + (long)local_424 * 8);
    auVar2 = vcvtph2ps_f16c(auVar9);
    fStack_4b4 = auVar2._12_4_;
    local_4d0._4_4_ = fStack_4b4;
    local_4d0._0_4_ = fStack_4b4;
    fStack_4c8 = fStack_4b4;
    fStack_4c4 = fStack_4b4;
    local_270 = auVar2._0_4_;
    fStack_26c = auVar2._4_4_;
    fStack_268 = auVar2._8_4_;
    local_4c0._4_4_ = fStack_26c * fStack_4b4;
    local_4c0._0_4_ = local_270 * fStack_4b4;
    fStack_4b8 = fStack_268 * fStack_4b4;
    fStack_4b4 = fStack_4b4 * fStack_4b4;
    auVar2 = vinsertps_avx(_local_4c0,_local_4d0,0x30);
    local_290 = auVar2._0_4_;
    fStack_28c = auVar2._4_4_;
    fStack_288 = auVar2._8_4_;
    fStack_284 = auVar2._12_4_;
    local_4e0 = CONCAT44((int)(fStack_28c * 255.0 + 0.5),(int)(local_290 * 255.0 + 0.5));
    uStack_4d8._0_4_ = (int)(fStack_288 * 255.0 + 0.5);
    uStack_4d8._4_4_ = (int)(fStack_284 * 255.0 + 0.5);
    auVar3._8_8_ = uStack_4d8;
    auVar3._0_8_ = local_4e0;
    auVar2._8_8_ = uStack_4d8;
    auVar2._0_8_ = local_4e0;
    auVar2 = vpackusdw_avx(auVar3,auVar2);
    auVar2 = vpshuflw_avx(auVar2,0xc6);
    auVar2 = vpackuswb_avx(auVar2,auVar2);
    local_220 = auVar2._0_4_;
    in_RDI[local_424] = local_220;
  }
  return in_RDI;
}

Assistant:

const uint *QT_FASTCALL fetchRGBA16FToARGB32PM_avx2(uint *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    const __m256 vf = _mm256_set1_ps(255.0f);
    const __m256 vh = _mm256_set1_ps(0.5f);
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        vsf = _mm256_mul_ps(vsf, vf);
        vsf = _mm256_add_ps(vsf, vh);
        __m256i vsi = _mm256_cvttps_epi32(vsf);
        vsi = _mm256_packus_epi32(vsi, vsi);
        vsi = _mm256_shufflelo_epi16(vsi, _MM_SHUFFLE(3, 0, 1, 2));
        vsi = _mm256_permute4x64_epi64(vsi, _MM_SHUFFLE(3, 1, 2, 0));
        __m128i vsi128 = _mm256_castsi256_si128(vsi);
        vsi128 = _mm_packus_epi16(vsi128, vsi128);
        _mm_storel_epi64((__m128i *)(buffer + i), vsi128);
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        vsf = _mm_mul_ps(vsf, _mm_set1_ps(255.0f));
        vsf = _mm_add_ps(vsf, _mm_set1_ps(0.5f));
        __m128i vsi = _mm_cvttps_epi32(vsf);
        vsi = _mm_packus_epi32(vsi, vsi);
        vsi = _mm_shufflelo_epi16(vsi, _MM_SHUFFLE(3, 0, 1, 2));
        vsi = _mm_packus_epi16(vsi, vsi);
        buffer[i] = _mm_cvtsi128_si32(vsi);
    }
    return buffer;
}